

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

bool __thiscall
Rml::Context::ProcessMouseButtonUp(Context *this,int button_index,int key_modifier_state)

{
  Element *pEVar1;
  bool bVar2;
  bool bVar3;
  Element *pEVar4;
  reference ppEVar5;
  pointer pSVar6;
  undefined1 local_a0 [8];
  Dictionary drag_parameters;
  String local_80;
  Element *local_60;
  Element *element;
  iterator __end2;
  iterator __begin2;
  ElementList *__range2;
  bool result;
  undefined1 local_30 [8];
  Dictionary parameters;
  int key_modifier_state_local;
  int button_index_local;
  Context *this_local;
  
  parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = key_modifier_state;
  parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = button_index;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
              *)local_30);
  GenerateMouseEventParameters
            (this,(flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                   *)local_30,
             parameters.m_container.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  GenerateKeyModifierEventParameters
            (this,(Dictionary *)local_30,
             (int)parameters.m_container.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar2 = IsMouseInteracting(this);
  if (parameters.m_container.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    if (this->hover != (Element *)0x0) {
      Element::DispatchEvent(this->hover,Mouseup,(Dictionary *)local_30);
    }
    if (((this->hover != (Element *)0x0) && (this->active != (Element *)0x0)) &&
       (pEVar1 = this->active, pEVar4 = FindFocusElement(this->hover), pEVar1 == pEVar4)) {
      Element::DispatchEvent(this->active,Click,(Dictionary *)local_30);
    }
    __end2 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::begin
                       (&this->active_chain);
    element = (Element *)
              ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::end
                        (&this->active_chain);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                                       *)&element), bVar3) {
      ppEVar5 = __gnu_cxx::
                __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                ::operator*(&__end2);
      pEVar1 = *ppEVar5;
      local_60 = pEVar1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"active",
                 (allocator<char> *)
                 ((long)&drag_parameters.m_container.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      Element::SetPseudoClass(pEVar1,&local_80,false);
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&drag_parameters.m_container.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      __gnu_cxx::
      __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
      ::operator++(&__end2);
    }
    ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::clear(&this->active_chain);
    this->active = (Element *)0x0;
    if (this->drag != (Element *)0x0) {
      if ((this->drag_started & 1U) != 0) {
        itlib::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
        ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                    *)local_a0);
        GenerateMouseEventParameters
                  (this,(flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                         *)local_a0,-1);
        GenerateDragEventParameters(this,(Dictionary *)local_a0);
        GenerateKeyModifierEventParameters
                  (this,(Dictionary *)local_a0,
                   (int)parameters.m_container.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (((this->drag_hover != (Element *)0x0) && ((this->drag_verbose & 1U) != 0)) &&
           (Element::DispatchEvent(this->drag_hover,Dragdrop,(Dictionary *)local_a0),
           this->drag_hover != (Element *)0x0)) {
          Element::DispatchEvent(this->drag_hover,Dragout,(Dictionary *)local_a0);
        }
        if (this->drag != (Element *)0x0) {
          Element::DispatchEvent(this->drag,Dragend,(Dictionary *)local_a0);
        }
        ReleaseDragClone(this);
        itlib::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
        ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                     *)local_a0);
      }
      this->drag = (Element *)0x0;
      this->drag_hover = (Element *)0x0;
      itlib::
      flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
      ::clear(&this->drag_hover_chain);
      ProcessMouseMove(this,(this->mouse_position).x,(this->mouse_position).y,
                       (int)parameters.m_container.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else if (this->hover != (Element *)0x0) {
    Element::DispatchEvent(this->hover,Mouseup,(Dictionary *)local_30);
  }
  pSVar6 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::
           operator->(&this->scroll_controller);
  bVar3 = ScrollController::HasAutoscrollMoved(pSVar6);
  if (bVar3) {
    pSVar6 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::
             operator->(&this->scroll_controller);
    ScrollController::Reset(pSVar6);
  }
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
               *)local_30);
  return (bool)((bVar2 ^ 0xffU) & 1);
}

Assistant:

bool Context::ProcessMouseButtonUp(int button_index, int key_modifier_state)
{
	Dictionary parameters;
	GenerateMouseEventParameters(parameters, button_index);
	GenerateKeyModifierEventParameters(parameters, key_modifier_state);

	// We want to return the interaction state before handling the mouse up events, so that any active element that is released is considered to
	// capture the event.
	const bool result = !IsMouseInteracting();

	// Process primary click.
	if (button_index == 0)
	{
		// The elements in the new hover chain have the 'onmouseup' event called on them.
		if (hover)
			hover->DispatchEvent(EventId::Mouseup, parameters);

		// If the active element (the one that was being hovered over when the mouse button was pressed) is still being
		// hovered over, we click it.
		if (hover && active && active == FindFocusElement(hover))
		{
			active->DispatchEvent(EventId::Click, parameters);
		}

		// Unset the 'active' pseudo-class on all the elements in the active chain; because they may not necessarily
		// have had 'onmouseup' called on them, we can't guarantee this has happened already.
		for (Element* element : active_chain)
			element->SetPseudoClass("active", false);
		active_chain.clear();
		active = nullptr;

		if (drag)
		{
			if (drag_started)
			{
				Dictionary drag_parameters;
				GenerateMouseEventParameters(drag_parameters);
				GenerateDragEventParameters(drag_parameters);
				GenerateKeyModifierEventParameters(drag_parameters, key_modifier_state);

				if (drag_hover)
				{
					if (drag_verbose)
					{
						drag_hover->DispatchEvent(EventId::Dragdrop, drag_parameters);
						// User may have removed the element, do an extra check.
						if (drag_hover)
							drag_hover->DispatchEvent(EventId::Dragout, drag_parameters);
					}
				}

				if (drag)
					drag->DispatchEvent(EventId::Dragend, drag_parameters);

				ReleaseDragClone();
			}

			drag = nullptr;
			drag_hover = nullptr;
			drag_hover_chain.clear();

			// We may have changes under our mouse, this ensures that the hover chain is properly updated
			ProcessMouseMove(mouse_position.x, mouse_position.y, key_modifier_state);
		}
	}
	else
	{
		// Not the left mouse button, so we're not doing any special processing.
		if (hover)
			hover->DispatchEvent(EventId::Mouseup, parameters);
	}

	// If we have autoscrolled while holding the middle mouse button, release the autoscroll mode now.
	if (scroll_controller->HasAutoscrollMoved())
		scroll_controller->Reset();

	return result;
}